

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::iterate
          (FeedbackPrimitiveTypeCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  undefined8 uVar2;
  RenderContext *pRVar3;
  TestLog *log;
  __normal_iterator<const_tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
  __last;
  undefined1 auVar4 [16];
  GLuint GVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  GLuint GVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  void *pvVar13;
  __normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
  __first;
  undefined4 extraout_var_00;
  RenderTarget *pRVar14;
  TestError *pTVar15;
  undefined4 uVar16;
  int ndx;
  int iVar17;
  int iVar18;
  long lVar19;
  int dx;
  long lVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  GLuint primitivesGeneratedResult;
  undefined1 auStack_2c4 [4];
  undefined8 uStack_2c0;
  pointer local_2b8;
  int local_298;
  int iStack_294;
  undefined8 uStack_290;
  int local_288;
  Vector<bool,_4> local_284;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> feedbackResults;
  Surface feedbackResult;
  Surface nonFeedbackResult;
  Query primitivesGeneratedQuery;
  VertexArray vao;
  Vec4 generatedElementVertex;
  undefined1 local_1d0 [384];
  Vector<float,_4> local_50;
  Vec4 equalThreshold;
  
  uStack_2c0._4_4_ = (float)primitivesGeneratedResult._4_4_;
  tcu::Surface::Surface(&feedbackResult,0x80,0x80);
  tcu::Surface::Surface(&nonFeedbackResult,0x80,0x80);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar8);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper
            (&primitivesGeneratedQuery,((this->super_TestCase).m_context)->m_renderCtx);
  iVar8 = (**(code **)(lVar19 + 0x780))((this->m_feedbackProgram->m_program).m_program,"a_position")
  ;
  if ((ulong)this->m_geometryOutputType < 3) {
    uVar16 = *(undefined4 *)(&DAT_018c41c8 + (ulong)this->m_geometryOutputType * 4);
  }
  else {
    uVar16 = 0xffffffff;
  }
  if (iVar8 == -1) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,"a_position was -1",(allocator<char> *)&primitivesGeneratedResult
              );
    tcu::TestError::TestError(pTVar15,(string *)local_1d0);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering with transform feedback");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar19 + 0x1a00))(0,0,feedbackResult.m_width,feedbackResult.m_height);
  (**(code **)(lVar19 + 0x1c0))(0,0);
  (**(code **)(lVar19 + 0x188))(0x4000);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x412);
  (**(code **)(lVar19 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar19 + 0x40))(0x8892,this->m_patchBuffer);
  (**(code **)(lVar19 + 0x19f0))(iVar8,4,0x1406,0,0);
  (**(code **)(lVar19 + 0x610))(iVar8);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x418);
  (**(code **)(lVar19 + 0x1680))((this->m_feedbackProgram->m_program).m_program);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41b);
  (**(code **)(lVar19 + 0xfd8))(0x8e72,4);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41e);
  (**(code **)(lVar19 + 0x20))(0x8c87,primitivesGeneratedQuery.super_ObjectWrapper.m_object);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"begin GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x421);
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Begin transform feedback with mode ");
  uStack_2c0._0_4_ = (float)uVar16;
  _primitivesGeneratedResult = (TextureFormat)glu::getPrimitiveTypeName;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)&primitivesGeneratedResult,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar19 + 0x30))(uVar16);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"begin xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x426);
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar19 + 0x538))(0xe,0,4);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42b);
  (**(code **)(lVar19 + 0x638))();
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"end xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42e);
  (**(code **)(lVar19 + 0x628))(0x8c87);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"end GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x431);
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&feedbackResult);
  glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1d0);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x434);
  auVar4._12_4_ = 0;
  auVar4._0_12_ = _auStack_2c4;
  _primitivesGeneratedResult = (Enum<int,_2UL>)(auVar4 << 0x20);
  (**(code **)(lVar19 + 0xa20))(primitivesGeneratedQuery.super_ObjectWrapper.m_object,0x8866);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"get GL_PRIMITIVES_GENERATED value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x43a);
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying GL_PRIMITIVES_GENERATED, expecting ");
  iVar8 = getNumGeneratedPrimitives(this);
  std::ostream::operator<<(poVar1,iVar8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  GVar5 = primitivesGeneratedResult;
  GVar10 = getNumGeneratedPrimitives(this);
  if (GVar5 == GVar10) {
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"GL_PRIMITIVES_GENERATED valid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Error, GL_PRIMITIVES_GENERATED was ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got unexpected GL_PRIMITIVES_GENERATED");
  }
  iVar8 = getNumGeneratedElementsPerPrimitive(this);
  iVar11 = getNumGeneratedPrimitives(this);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&feedbackResults,(long)(iVar11 * iVar8),(allocator_type *)local_1d0);
  pvVar13 = (void *)(**(code **)(lVar19 + 0xd00))
                              (0x8c8e,0,CONCAT44(feedbackResults.
                                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                 (int)feedbackResults.
                                                                                                            
                                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) -
                                        (long)feedbackResults.
                                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,1);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x44d);
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Reading transform feedback buffer.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (pvVar13 == (void *)0x0) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,"mapBufferRange returned null",
               (allocator<char> *)&primitivesGeneratedResult);
    tcu::TestError::TestError(pTVar15,(string *)local_1d0);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  memcpy(feedbackResults.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar13,
         (long)((int)feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (int)feedbackResults.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0);
  cVar6 = (**(code **)(lVar19 + 0x1670))(0x8c8e);
  dVar9 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar9,"unmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x456);
  if (cVar6 != '\x01') {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1d0,"unmapBuffer failed, did not return true",
               (allocator<char> *)&primitivesGeneratedResult);
    tcu::TestError::TestError(pTVar15,(string *)local_1d0);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_288 = getGeometryAmplification(this);
  iVar8 = getNumGeneratedElementsPerPrimitive(this);
  local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying feedback results.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1d0 + 8);
  local_298 = 0;
  iStack_294 = 0;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  iVar17 = 0;
  iVar11 = 0;
  do {
    iVar12 = getNumTessellatedPrimitives(this);
    if (iVar12 <= iVar17) {
      if (8 < iVar11) {
        local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1d0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Omitted ");
        std::ostream::operator<<(poVar1,iVar11 + -8);
        std::operator<<((ostream *)poVar1," error(s).");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
      }
      _primitivesGeneratedResult = (TextureFormat)0x0;
      uStack_2c0._0_4_ = 0.0;
      uStack_2c0._4_4_ = 0.0;
      local_2b8 = (pointer)0x0;
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Comparing result image against feedback results.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      __last._M_current._4_4_ =
           feedbackResults.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish._4_4_;
      __last._M_current._0_4_ =
           (int)feedbackResults.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      std::
      unique_copy<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>const*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,std::back_insert_iterator<std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>>
                ((__normal_iterator<const_tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                  )feedbackResults.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,__last,
                 (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &primitivesGeneratedResult);
      std::
      __sort<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,4>const&,tcu::Vector<float,4>const&)>>
                ((__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                  )_primitivesGeneratedResult,uStack_2c0,
                 (_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_4>_&,_const_tcu::Vector<float,_4>_&)>
                  )0x131746d);
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (_primitivesGeneratedResult,uStack_2c0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::erase
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &primitivesGeneratedResult,(const_iterator)__first._M_current,
                 (const_iterator)uStack_2c0);
      lVar19 = 0;
      while( true ) {
        pvVar13 = feedbackResult.m_pixels.m_ptr;
        iVar8 = feedbackResult.m_width;
        if ((int)((ulong)((long)uStack_2c0 - (long)_primitivesGeneratedResult) >> 4) <= lVar19)
        break;
        uVar2 = *(undefined8 *)((pointer)((long)_primitivesGeneratedResult + lVar19 * 0x10))->m_data
        ;
        local_298 = feedbackResult.m_width;
        iStack_294 = feedbackResult.m_height;
        uStack_290 = 0;
        fVar23 = (float)feedbackResult.m_height;
        fVar22 = floorf((float)feedbackResult.m_width * ((float)uVar2 * 0.5 + 0.5) + 0.5);
        fVar23 = floorf(fVar23 * ((float)((ulong)uVar2 >> 0x20) * 0.5 + 0.5) + 0.5);
        generatedElementVertex.m_data[0] = (float)(int)fVar22;
        generatedElementVertex.m_data[1] = (float)(int)fVar23;
        iVar17 = ((int)generatedElementVertex.m_data[1] + -2) * iVar8 +
                 (int)generatedElementVertex.m_data[0];
        bVar7 = false;
        iVar11 = -2;
        while ((iVar11 < 3 && (!bVar7))) {
          lVar20 = -2;
          while ((lVar20 < 3 && (!bVar7))) {
            iVar12 = (int)generatedElementVertex.m_data[0] + (int)lVar20;
            bVar7 = true;
            if (((-1 < iVar12) &&
                (((iVar12 < iVar8 && (-1 < iVar11 + (int)generatedElementVertex.m_data[1])) &&
                 (iVar11 + (int)generatedElementVertex.m_data[1] < iStack_294)))) &&
               (bVar7 = false,
               (*(uint *)((long)pvVar13 + (long)(iVar17 + (int)lVar20) * 4) & 0xffffff) != 0)) {
              bVar7 = true;
            }
            lVar20 = lVar20 + 1;
          }
          iVar11 = iVar11 + 1;
          iVar17 = iVar17 + iVar8;
        }
        poVar1 = (ostringstream *)(local_1d0 + 8);
        if (!bVar7) {
          local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"Vertex ");
          tcu::operator<<((ostream *)poVar1,
                          (Vector<float,_4> *)(lVar19 * 0x10 + (long)_primitivesGeneratedResult));
          std::operator<<((ostream *)poVar1,"\n");
          std::operator<<((ostream *)poVar1,"\tCould not find rasterization output for vertex.\n");
          std::operator<<((ostream *)poVar1,"\tExpected non-black pixels near ");
          tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&generatedElementVertex);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"invalid result image");
        }
        lVar19 = lVar19 + 1;
      }
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    &primitivesGeneratedResult);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      glu::ObjectWrapper::~ObjectWrapper(&primitivesGeneratedQuery.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
      iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar19 = CONCAT44(extraout_var_00,iVar8);
      glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)5> *)&primitivesGeneratedResult,
                 ((this->super_TestCase).m_context)->m_renderCtx);
      iVar8 = (**(code **)(lVar19 + 0x780))
                        ((this->m_nonFeedbackProgram->m_program).m_program,"a_position");
      if (iVar8 == -1) {
        pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1d0,"a_position was -1",(allocator<char> *)&vao);
        tcu::TestError::TestError(pTVar15,(string *)local_1d0);
        __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Rendering without transform feedback");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar19 + 0x1a00))(0,0,nonFeedbackResult.m_width,nonFeedbackResult.m_height);
      (**(code **)(lVar19 + 0x1c0))(0,0);
      (**(code **)(lVar19 + 0x188))(0x4000);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"clear",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x471);
      (**(code **)(lVar19 + 0xd8))((ulong)local_2b8 & 0xffffffff);
      (**(code **)(lVar19 + 0x40))(0x8892,this->m_patchBuffer);
      (**(code **)(lVar19 + 0x19f0))(iVar8,4,0x1406,0,0,0);
      (**(code **)(lVar19 + 0x610))(iVar8);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"setup attribs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x477);
      (**(code **)(lVar19 + 0x1680))((this->m_nonFeedbackProgram->m_program).m_program);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"use program",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x47a);
      (**(code **)(lVar19 + 0xfd8))(0x8e72,4);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"set patch param",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x47d);
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      (**(code **)(lVar19 + 0x538))(0xe,0,4);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"draw patches",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x482);
      pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&nonFeedbackResult);
      glu::readPixels(pRVar3,0,0,(PixelBufferAccess *)local_1d0);
      dVar9 = (**(code **)(lVar19 + 0x800))();
      glu::checkError(dVar9,"readPixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x485);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&primitivesGeneratedResult);
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      if (pRVar14->m_numSamples < 2) {
        tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&feedbackResult);
        tcu::Surface::getAccess((PixelBufferAccess *)&primitivesGeneratedResult,&nonFeedbackResult);
        vao.super_ObjectWrapper.m_gl = (Functions *)0x800000008;
        vao.super_ObjectWrapper.m_traits = (ObjectTraits *)0xff00000008;
        primitivesGeneratedQuery.super_ObjectWrapper.m_gl = (Functions *)&DAT_100000001;
        primitivesGeneratedQuery.super_ObjectWrapper.m_traits._0_4_ = 0;
        bVar7 = tcu::intThresholdPositionDeviationCompare
                          (log,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)local_1d0
                           ,(ConstPixelBufferAccess *)&primitivesGeneratedResult,(UVec4 *)&vao,
                           (IVec3 *)&primitivesGeneratedQuery.super_ObjectWrapper,true,
                           COMPARE_LOG_RESULT);
      }
      else {
        tcu::Surface::getAccess((PixelBufferAccess *)local_1d0,&feedbackResult);
        tcu::Surface::getAccess((PixelBufferAccess *)&primitivesGeneratedResult,&nonFeedbackResult);
        bVar7 = tcu::fuzzyCompare(log,"ImageCompare","Image comparison",
                                  (ConstPixelBufferAccess *)local_1d0,
                                  (ConstPixelBufferAccess *)&primitivesGeneratedResult,0.03,
                                  COMPARE_LOG_RESULT);
      }
      if (bVar7 == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      tcu::Surface::~Surface(&nonFeedbackResult);
      tcu::Surface::~Surface(&feedbackResult);
      return STOP;
    }
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&primitivesGeneratedResult,
               feedbackResults.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + local_298);
    if ((0.40000102 < ABS((float)primitivesGeneratedResult)) ||
       (0.40000102 < ABS((float)auStack_2c4))) {
LAB_01316142:
      iVar12 = iVar11 + 1;
      if (7 < iVar11) goto LAB_0131622c;
      local_1d0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1d0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Element at index ");
      std::ostream::operator<<(this_00,local_298);
      std::operator<<((ostream *)this_00," (tessellation invocation ");
      std::ostream::operator<<(this_00,iVar17);
      std::operator<<((ostream *)this_00,")\n");
      std::operator<<((ostream *)this_00,
                      "\texpected vertex in range: ( [-0.4, 0.4], [-0.4, 0.4], 0.0, 1.0 )\n");
      std::operator<<((ostream *)this_00,"\tgot: ");
      tcu::operator<<((ostream *)this_00,(Vector<float,_4> *)&primitivesGeneratedResult);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "invalid feedback output");
      local_298 = local_298 + 1;
      iStack_294 = 0;
    }
    else {
      auVar24._0_4_ = -(float)uStack_2c0;
      auVar24._4_4_ = 0x80000000;
      auVar24._8_4_ = 0x80000000;
      auVar24._12_4_ = 0x80000000;
      if (auVar24._0_4_ <= (float)uStack_2c0) {
        auVar24._0_4_ = (float)uStack_2c0;
      }
      if (1e-06 <= auVar24._0_4_) goto LAB_01316142;
      fVar22 = uStack_2c0._4_4_ + -1.0;
      auVar25._0_4_ = -fVar22;
      auVar25._4_4_ = 0x80000000;
      auVar25._8_4_ = 0x80000000;
      auVar25._12_4_ = 0x80000000;
      if (auVar25._0_4_ <= fVar22) {
        auVar25._0_4_ = fVar22;
      }
      iVar12 = iVar11;
      if (1e-06 <= auVar25._0_4_) goto LAB_01316142;
LAB_0131622c:
      for (iVar11 = 0; iVar11 != local_288; iVar11 = iVar11 + 1) {
        for (iVar21 = 0; iVar18 = local_298 + iVar21, iVar8 != iVar21; iVar21 = iVar21 + 1) {
          tcu::Vector<float,_4>::Vector
                    (&generatedElementVertex,
                     feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar18);
          tcu::Vector<float,_4>::Vector(&equalThreshold,1e-06);
          tcu::operator-((tcu *)&local_50,(Vector<float,_4> *)&primitivesGeneratedResult,
                         &generatedElementVertex);
          tcu::abs<float,4>((tcu *)local_1d0,&local_50);
          tcu::greaterThan<float,4>((tcu *)&local_284,(Vector<float,_4> *)local_1d0,&equalThreshold)
          ;
          bVar7 = tcu::boolAny<4>(&local_284);
          if (bVar7) {
            if (iVar12 < 8) {
              local_1d0._0_8_ =
                   ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar1);
              std::operator<<((ostream *)poVar1,"Element at index ");
              std::ostream::operator<<(poVar1,iVar18);
              std::operator<<((ostream *)poVar1," (tessellation invocation ");
              std::ostream::operator<<(poVar1,iVar17);
              std::operator<<((ostream *)poVar1,", geometry primitive ");
              std::ostream::operator<<(poVar1,iVar11);
              std::operator<<((ostream *)poVar1,", emitted vertex ");
              std::ostream::operator<<(poVar1,iVar21);
              std::operator<<((ostream *)poVar1,"):\n");
              std::operator<<((ostream *)poVar1,
                              "\tfeedback result was not contant over whole primitive.\n");
              std::operator<<((ostream *)poVar1,"\tfirst emitted value: ");
              tcu::operator<<((ostream *)poVar1,(Vector<float,_4> *)&primitivesGeneratedResult);
              std::operator<<((ostream *)poVar1,"\n");
              std::operator<<((ostream *)poVar1,"\tcurrent emitted value:");
              tcu::operator<<((ostream *)poVar1,&generatedElementVertex);
              std::operator<<((ostream *)poVar1,"\n");
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar1);
            }
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,
                       "got multiple different feedback values for a single primitive");
            iVar12 = iVar12 + 1;
          }
        }
        iStack_294 = 0;
        local_298 = iVar18;
      }
    }
    iVar17 = iVar17 + 1;
    iVar11 = iVar12;
  } while( true );
}

Assistant:

FeedbackPrimitiveTypeCase::IterateResult FeedbackPrimitiveTypeCase::iterate (void)
{
	tcu::Surface feedbackResult		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface nonFeedbackResult	(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// render with and without XFB
	renderWithFeedback(feedbackResult);
	renderWithoutFeedback(nonFeedbackResult);

	// compare
	{
		bool imageOk;

		m_testCtx.getLog() << tcu::TestLog::Message << "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback." << tcu::TestLog::EndMessage;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										feedbackResult.getAccess(),
										nonFeedbackResult.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																feedbackResult.getAccess(),
																nonFeedbackResult.getAccess(),
																tcu::UVec4(8, 8, 8, 255),						//!< threshold
																tcu::IVec3(1, 1, 0),							//!< 3x3 search kernel
																true,											//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (!imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}